

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall memory::address<false,20,24,0>(memory *this,context *ctx,token *token,opcode *op)

{
  token local_c0;
  byte local_91;
  undefined1 local_90 [55];
  byte local_59;
  undefined1 local_58 [7];
  uint8_t regster;
  _Storage<context::program_type,_true> local_30;
  byte local_29;
  opcode *local_28;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  local_29 = 0;
  local_28 = op;
  op_local = (opcode *)token;
  token_local = (token *)ctx;
  ctx_local = (context *)this;
  confirm_type((token *)this,(token_type)token);
  local_30._M_value._0_1_ = error::operator_cast_to_bool((error *)this);
  if ((bool)local_30._M_value._0_1_) {
    local_29 = 1;
  }
  local_30._M_value._1_3_ = 0;
  if ((local_29 & 1) == 0) {
    error::~error((error *)this);
  }
  if (local_30._M_value == vertex) {
    context::tokenize((token *)local_58,(context *)token_local);
    memcpy(op_local,local_58,0x24);
    local_59 = 0xff;
    if (op_local[1].reuse == 2) {
      local_59 = (byte)op_local->reuse;
      context::tokenize((token *)(local_90 + 8),(context *)token_local);
      memcpy(op_local,local_90 + 8,0x24);
      try_reuse((context *)local_90,token_local,op_local,(int)local_28);
      error::~error((error *)local_90);
    }
    opcode::add_bits(local_28,(ulong)local_59 << 8);
    local_91 = 0;
    confirm_type((token *)this,(token_type)op_local);
    local_30._M_value._0_1_ = error::operator_cast_to_bool((error *)this);
    if ((bool)local_30._M_value._0_1_) {
      local_91 = 1;
    }
    local_30._M_value._1_3_ = 0;
    if ((local_91 & 1) == 0) {
      error::~error((error *)this);
    }
    if (local_30._M_value == vertex) {
      context::tokenize(&local_c0,(context *)token_local);
      memcpy(op_local,&local_c0,0x24);
      memset(this,0,8);
      error::error((error *)this);
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(address)
    {
        CHECK(confirm_type(token, token_type::bracket_left));

        token = ctx.tokenize();
        uint8_t regster = ZERO_REGISTER;
        if (token.type == token_type::regster) {
            regster = token.data.regster;
            token = ctx.tokenize();

            try_reuse(ctx, token, op, 8);
        }
        op.add_bits(static_cast<uint64_t>(regster) << 8);

        if constexpr (imm_offset) {
            if (token.type == token_type::immediate) {
                const int is_zero_reg = regster == ZERO_REGISTER;
                const int64_t min = is_zero_reg ? 0 : -(1 << (size - 1));
                const int64_t max = max_bits(is_zero_reg ? size : (size - 1));

                uint64_t value;
                CHECK(convert_integer(token, min, max, &value));
                value >>= shr;
                op.add_bits((value & max_bits(size)) << addr);
                token = ctx.tokenize();
            }
        }

        CHECK(confirm_type(token, token_type::bracket_right));
        token = ctx.tokenize();
        return {};
    }